

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O2

bool __thiscall
draco::PlyDecoder::ReadPropertiesToAttribute<float>
          (PlyDecoder *this,
          vector<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
          *properties,PointAttribute *attribute,int num_vertices)

{
  pointer ppPVar1;
  size_t __n;
  PlyPropertyReader<float> *this_00;
  size_type __n_00;
  int prop;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  allocator_type local_65;
  uint local_64;
  vector<float,_std::allocator<float>_> memory;
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  readers;
  
  readers.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  readers.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  readers.
  super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_64 = num_vertices;
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::reserve(&readers,(long)(properties->
                           super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(properties->
                           super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar3 = 0;
  while( true ) {
    ppPVar1 = (properties->
              super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    __n_00 = (long)(properties->
                   super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
    if (__n_00 <= uVar3) break;
    this_00 = (PlyPropertyReader<float> *)operator_new(0x28);
    PlyPropertyReader<float>::PlyPropertyReader(this_00,ppPVar1[uVar3]);
    memory.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)this_00;
    std::
    vector<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>>>
    ::
    emplace_back<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>>
              ((vector<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>,std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,std::default_delete<draco::PlyPropertyReader<float>>>>>
                *)&readers,
               (unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                *)&memory);
    std::
    unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
    ::~unique_ptr((unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                   *)&memory);
    uVar3 = uVar3 + 1;
  }
  std::vector<float,_std::allocator<float>_>::vector(&memory,__n_00,&local_65);
  uVar3 = (ulong)local_64;
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar2 = 0;
        uVar2 < (ulong)((long)(properties->
                              super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(properties->
                              super__Vector_base<const_draco::PlyProperty_*,_std::allocator<const_draco::PlyProperty_*>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      fVar5 = std::function<float_(int)>::operator()
                        (&(readers.
                           super__Vector_base<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
                           super___uniq_ptr_impl<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::PlyPropertyReader<float>_*,_std::default_delete<draco::PlyPropertyReader<float>_>_>
                           .super__Head_base<0UL,_draco::PlyPropertyReader<float>_*,_false>.
                          _M_head_impl)->convert_value_func_,(int)uVar4);
      memory.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar2] = fVar5;
    }
    __n = (attribute->super_GeometryAttribute).byte_stride_;
    memcpy((void *)(__n * uVar4 +
                   (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start),
           memory.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start,__n);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&memory.super__Vector_base<float,_std::allocator<float>_>);
  std::
  vector<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>,_std::allocator<std::unique_ptr<draco::PlyPropertyReader<float>,_std::default_delete<draco::PlyPropertyReader<float>_>_>_>_>
  ::~vector(&readers);
  return true;
}

Assistant:

bool PlyDecoder::ReadPropertiesToAttribute(
    const std::vector<const PlyProperty *> &properties,
    PointAttribute *attribute, int num_vertices) {
  std::vector<std::unique_ptr<PlyPropertyReader<DataTypeT>>> readers;
  readers.reserve(properties.size());
  for (int prop = 0; prop < properties.size(); ++prop) {
    readers.push_back(std::unique_ptr<PlyPropertyReader<DataTypeT>>(
        new PlyPropertyReader<DataTypeT>(properties[prop])));
  }
  std::vector<DataTypeT> memory(properties.size());
  for (PointIndex::ValueType i = 0; i < static_cast<uint32_t>(num_vertices);
       ++i) {
    for (int prop = 0; prop < properties.size(); ++prop) {
      memory[prop] = readers[prop]->ReadValue(i);
    }
    attribute->SetAttributeValue(AttributeValueIndex(i), memory.data());
  }
  return true;
}